

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

Float __thiscall pbrt::Vertex::PDF(Vertex *this,Integrator *integrator,Vertex *prev,Vertex *next)

{
  undefined8 uVar1;
  undefined8 uVar2;
  VertexType VVar3;
  Vector3f wiRender;
  Float FVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  Vector3f woRender;
  Float pdf;
  Float unused;
  Float local_b0;
  float local_ac;
  Vector3f local_a8;
  undefined1 local_98 [16];
  Float local_84;
  RayDifferential local_80;
  
  if (this->type == Light) {
    FVar4 = PDFLight(this,integrator,next);
    return FVar4;
  }
  local_a8.super_Tuple3<pbrt::Vector3,_float>.z =
       ((next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
       (next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 -
       ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
       (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
  uVar1 = *(undefined8 *)
           &(next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar9 = vinsertps_avx(*(undefined1 (*) [16])&next->field_2,
                         ZEXT416((uint)(next->field_2).ei.super_Interaction.pi.
                                       super_Point3<pbrt::Interval>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  auVar7._0_4_ = ((float)uVar1 + auVar9._0_4_) * 0.5;
  auVar7._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar9._4_4_) * 0.5;
  auVar7._8_4_ = (auVar9._8_4_ + 0.0) * 0.5;
  auVar7._12_4_ = (auVar9._12_4_ + 0.0) * 0.5;
  uVar1 = *(undefined8 *)
           &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar9 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                         ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                       super_Point3<pbrt::Interval>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  auVar13._0_4_ = ((float)uVar1 + auVar9._0_4_) * 0.5;
  auVar13._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar9._4_4_) * 0.5;
  auVar13._8_4_ = (auVar9._8_4_ + 0.0) * 0.5;
  auVar13._12_4_ = (auVar9._12_4_ + 0.0) * 0.5;
  auVar9 = vsubps_avx(auVar7,auVar13);
  local_a8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar9);
  auVar8._0_4_ = auVar9._0_4_ * auVar9._0_4_;
  auVar8._4_4_ = auVar9._4_4_ * auVar9._4_4_;
  auVar8._8_4_ = auVar9._8_4_ * auVar9._8_4_;
  auVar8._12_4_ = auVar9._12_4_ * auVar9._12_4_;
  auVar9 = vhaddps_avx(auVar8,auVar8);
  fVar5 = local_a8.super_Tuple3<pbrt::Vector3,_float>.z *
          local_a8.super_Tuple3<pbrt::Vector3,_float>.z + auVar9._0_4_;
  FVar4 = 0.0;
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    if (fVar5 < 0.0) {
      fVar5 = sqrtf(fVar5);
    }
    else {
      auVar9 = vsqrtss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
      fVar5 = auVar9._0_4_;
    }
    auVar9._8_8_ = 0;
    auVar9._0_4_ = local_a8.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar9._4_4_ = local_a8.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar14._4_4_ = fVar5;
    auVar14._0_4_ = fVar5;
    auVar14._8_4_ = fVar5;
    auVar14._12_4_ = fVar5;
    auVar9 = vdivps_avx(auVar9,auVar14);
    local_a8.super_Tuple3<pbrt::Vector3,_float>.z =
         local_a8.super_Tuple3<pbrt::Vector3,_float>.z / fVar5;
    local_a8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar9);
    if (prev == (Vertex *)0x0) {
      if (this->type != Camera) {
        LogFatal<char_const(&)[27]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
                   ,0x6db,"Check failed: %s",(char (*) [27])"type == VertexType::Camera");
      }
      auVar7 = ZEXT816(0) << 0x20;
      auVar9 = ZEXT816(0);
    }
    else {
      uVar1 = *(undefined8 *)
               &(prev->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar9 = vinsertps_avx(ZEXT416((uint)(prev->field_2).ei.super_Interaction.pi.
                                           super_Point3<pbrt::Interval>.
                                           super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low),
                             ZEXT416((uint)(prev->field_2).ei.super_Interaction.pi.
                                           super_Point3<pbrt::Interval>.
                                           super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
      uVar2 = *(undefined8 *)
               &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar7 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                             ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                           super_Point3<pbrt::Interval>.
                                           super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
      auVar16._0_4_ = ((float)uVar1 + auVar9._0_4_) * 0.5;
      auVar16._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar9._4_4_) * 0.5;
      auVar16._8_4_ = (auVar9._8_4_ + 0.0) * 0.5;
      auVar16._12_4_ = (auVar9._12_4_ + 0.0) * 0.5;
      auVar11._0_4_ = ((float)uVar2 + auVar7._0_4_) * 0.5;
      auVar11._4_4_ = ((float)((ulong)uVar2 >> 0x20) + auVar7._4_4_) * 0.5;
      auVar11._8_4_ = (auVar7._8_4_ + 0.0) * 0.5;
      auVar11._12_4_ = (auVar7._12_4_ + 0.0) * 0.5;
      auVar7 = vsubps_avx(auVar16,auVar11);
      auVar12._0_4_ = auVar7._0_4_ * auVar7._0_4_;
      auVar12._4_4_ = auVar7._4_4_ * auVar7._4_4_;
      auVar12._8_4_ = auVar7._8_4_ * auVar7._8_4_;
      auVar12._12_4_ = auVar7._12_4_ * auVar7._12_4_;
      auVar9 = vhaddps_avx(auVar12,auVar12);
      fVar18 = ((prev->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
               (prev->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 -
               ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
               (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      fVar5 = auVar9._0_4_ + fVar18 * fVar18;
      if ((fVar5 == 0.0) && (!NAN(fVar5))) {
        return 0.0;
      }
      if (fVar5 < 0.0) {
        local_ac = fVar18;
        local_98 = auVar7;
        fVar5 = sqrtf(fVar5);
        fVar18 = local_ac;
        auVar7 = local_98;
      }
      else {
        auVar9 = vsqrtss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
        fVar5 = auVar9._0_4_;
      }
      auVar10._4_4_ = fVar5;
      auVar10._0_4_ = fVar5;
      auVar10._8_4_ = fVar5;
      auVar10._12_4_ = fVar5;
      auVar9 = vdivps_avx(auVar7,auVar10);
      auVar7 = ZEXT416((uint)(fVar18 / fVar5));
    }
    local_b0 = 0.0;
    VVar3 = this->type;
    if (VVar3 == Medium) {
      auVar15._8_8_ = 0;
      auVar15._0_4_ = local_a8.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar15._4_4_ = local_a8.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar17._0_4_ = auVar9._0_4_ * local_a8.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar17._4_4_ = auVar9._4_4_ * local_a8.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar17._8_4_ = auVar9._8_4_ * 0.0;
      auVar17._12_4_ = auVar9._12_4_ * 0.0;
      auVar8 = vmovshdup_avx(auVar17);
      auVar9 = vfmadd231ss_fma(auVar8,auVar9,auVar15);
      auVar7 = vfmadd231ss_fma(auVar9,auVar7,
                               ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.z));
      fVar5 = *(float *)((ulong)(this->field_2).ei.field_0 & 0xffffffffffff);
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),
                               SUB6416(ZEXT464(0x3f800000),0));
      auVar7 = vfmadd213ss_fma(ZEXT416((uint)(fVar5 + fVar5)),auVar7,auVar9);
      auVar9 = vfnmadd213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),
                                SUB6416(ZEXT464(0x3f800000),0));
      fVar5 = auVar9._0_4_ * 0.07957747;
      auVar9 = vmaxss_avx(auVar7,ZEXT816(0));
      if (auVar9._0_4_ < 0.0) {
        local_98._0_4_ = auVar7._0_4_;
        local_ac = fVar5;
        fVar6 = sqrtf(auVar9._0_4_);
        fVar5 = local_ac;
        fVar18 = (float)local_98._0_4_;
      }
      else {
        auVar9 = vsqrtss_avx(auVar9,auVar9);
        fVar6 = auVar9._0_4_;
        fVar18 = auVar7._0_4_;
      }
      local_b0 = fVar5 / (fVar6 * fVar18);
    }
    else if (VVar3 == Surface) {
      wiRender.super_Tuple3<pbrt::Vector3,_float>.z = local_a8.super_Tuple3<pbrt::Vector3,_float>.z;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.x = local_a8.super_Tuple3<pbrt::Vector3,_float>.x;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.y = local_a8.super_Tuple3<pbrt::Vector3,_float>.y;
      woRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar9._0_8_;
      woRender.super_Tuple3<pbrt::Vector3,_float>.z = auVar7._0_4_;
      local_b0 = BSDF::PDF(&this->bsdf,woRender,wiRender,Radiance,All);
    }
    else {
      if (VVar3 != Camera) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
                 ,0x6e6,"Vertex::PDF(): Unimplemented");
      }
      Interaction::SpawnRay(&local_80,&(this->field_2).ei.super_Interaction,&local_a8);
      CameraHandle::PDF_We
                ((CameraHandle *)&(this->field_2).mi.phase,&local_80.super_Ray,&local_84,&local_b0);
    }
    FVar4 = ConvertDensity(this,local_b0,next);
  }
  return FVar4;
}

Assistant:

Float PDF(const Integrator &integrator, const Vertex *prev,
              const Vertex &next) const {
        if (type == VertexType::Light)
            return PDFLight(integrator, next);
        // Compute directions to preceding and next vertex
        Vector3f wn = next.p() - p();
        if (LengthSquared(wn) == 0)
            return 0;
        wn = Normalize(wn);
        Vector3f wp;
        if (prev) {
            wp = prev->p() - p();
            if (LengthSquared(wp) == 0)
                return 0;
            wp = Normalize(wp);
        } else
            CHECK(type == VertexType::Camera);

        // Compute directional density depending on the vertex type
        Float pdf = 0, unused;
        if (type == VertexType::Camera)
            ei.camera.PDF_We(ei.SpawnRay(wn), &unused, &pdf);
        else if (type == VertexType::Surface)
            pdf = bsdf.PDF(wp, wn);
        else if (type == VertexType::Medium)
            pdf = mi.phase.p(wp, wn);
        else
            LOG_FATAL("Vertex::PDF(): Unimplemented");

        // Return probability per unit area at vertex _next_
        return ConvertDensity(pdf, next);
    }